

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::InterfaceBlockBaseCase::init
          (InterfaceBlockBaseCase *this,EVP_PKEY_CTX *ctx)

{
  ContextType type;
  GLSLVersion version;
  int extraout_EAX;
  RenderContext *pRVar1;
  Program *this_00;
  Shader *this_01;
  DefaultBlock *pDVar2;
  StructType *pSVar3;
  Layout local_830;
  allocator<char> local_819;
  string local_818;
  VarType local_7f8;
  VariableDeclaration local_7e0;
  undefined1 local_780 [8];
  InterfaceBlock trailingInterfaceBlock;
  allocator<char> local_6d9;
  string local_6d8;
  VarType local_6b8;
  VarType local_6a0;
  VariableDeclaration local_688;
  Layout local_628;
  allocator<char> local_611;
  string local_610;
  VarType local_5f0;
  VarType local_5d8;
  VariableDeclaration local_5c0;
  VarType local_560;
  VarType local_548;
  VarType local_530;
  StructType *local_518;
  StructType *structPtr;
  allocator<char> local_4f9;
  string local_4f8;
  VarType local_4d8;
  VarType local_4c0;
  VariableDeclaration local_4a8;
  Layout local_448;
  allocator<char> local_431;
  string local_430;
  VarType local_410;
  VariableDeclaration local_3f8;
  value_type_conflict1 local_394;
  undefined1 local_390 [8];
  InterfaceBlock targetInterfaceBlock;
  allocator<char> local_2e9;
  string local_2e8;
  VarType local_2c8;
  VarType local_2b0;
  VariableDeclaration local_298;
  Layout local_238;
  allocator<char> local_221;
  string local_220;
  VarType local_200;
  VarType local_1e8;
  VariableDeclaration local_1d0;
  Layout local_170;
  allocator<char> local_159;
  string local_158;
  VarType local_138;
  VariableDeclaration local_120;
  undefined1 local_c0 [8];
  InterfaceBlock precedingInterfaceBlock;
  Shader *shader;
  GLSLVersion glslVersion;
  InterfaceBlockBaseCase *this_local;
  
  pRVar1 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar1->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  this_00 = (Program *)operator_new(0x48);
  ProgramInterfaceDefinition::Program::Program(this_00);
  this->m_program = this_00;
  this_01 = ProgramInterfaceDefinition::Program::addShader
                      (this->m_program,SHADERTYPE_COMPUTE,version);
  glu::InterfaceBlock::InterfaceBlock((InterfaceBlock *)local_c0);
  std::__cxx11::string::operator=
            ((string *)&precedingInterfaceBlock.memoryAccessQualifierFlags,"PrecedingInterface");
  local_c0._4_4_ = 0;
  precedingInterfaceBlock.layout.format = this->m_storage;
  std::__cxx11::string::operator=
            ((string *)(precedingInterfaceBlock.interfaceName.field_2._M_local_buf + 8),
             "precedingInstance");
  glu::VarType::VarType(&local_138,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"precedingMember",&local_159);
  glu::Layout::Layout(&local_170,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&local_120,&local_138,&local_158,STORAGE_LAST,INTERPOLATION_LAST,&local_170,0);
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
            ((vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
             ((long)&precedingInterfaceBlock.instanceName.field_2 + 8),&local_120);
  glu::VariableDeclaration::~VariableDeclaration(&local_120);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  glu::VarType::~VarType(&local_138);
  if (this->m_storage == STORAGE_BUFFER) {
    glu::VarType::VarType(&local_200,TYPE_FLOAT,PRECISION_HIGHP);
    glu::VarType::VarType(&local_1e8,&local_200,-1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"precedingMemberUnsizedArray",&local_221);
    glu::Layout::Layout(&local_238,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&local_1d0,&local_1e8,&local_220,STORAGE_LAST,INTERPOLATION_LAST,&local_238,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
              ((vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
               ((long)&precedingInterfaceBlock.instanceName.field_2 + 8),&local_1d0);
    glu::VariableDeclaration::~VariableDeclaration(&local_1d0);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
    glu::VarType::~VarType(&local_1e8);
    glu::VarType::~VarType(&local_200);
  }
  else {
    glu::VarType::VarType(&local_2c8,TYPE_FLOAT,PRECISION_HIGHP);
    glu::VarType::VarType(&local_2b0,&local_2c8,2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,"precedingMemberArray",&local_2e9);
    glu::Layout::Layout((Layout *)
                        &targetInterfaceBlock.dimensions.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,-1,-1,-1,FORMATLAYOUT_LAST,
                        MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&local_298,&local_2b0,&local_2e8,STORAGE_LAST,INTERPOLATION_LAST,
               (Layout *)
               &targetInterfaceBlock.dimensions.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
              ((vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
               ((long)&precedingInterfaceBlock.instanceName.field_2 + 8),&local_298);
    glu::VariableDeclaration::~VariableDeclaration(&local_298);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
    glu::VarType::~VarType(&local_2b0);
    glu::VarType::~VarType(&local_2c8);
  }
  pDVar2 = ProgramInterfaceDefinition::Shader::getDefaultBlock(this_01);
  std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::push_back
            (&pDVar2->interfaceBlocks,(value_type *)local_c0);
  glu::InterfaceBlock::~InterfaceBlock((InterfaceBlock *)local_c0);
  glu::InterfaceBlock::InterfaceBlock((InterfaceBlock *)local_390);
  std::__cxx11::string::operator=
            ((string *)&targetInterfaceBlock.memoryAccessQualifierFlags,"TargetInterface");
  local_390._4_4_ = 1;
  targetInterfaceBlock.layout.format = this->m_storage;
  if (this->m_caseType == CASE_UNNAMED_BLOCK) {
    std::__cxx11::string::operator=
              ((string *)(targetInterfaceBlock.interfaceName.field_2._M_local_buf + 8),"");
  }
  else {
    std::__cxx11::string::operator=
              ((string *)(targetInterfaceBlock.interfaceName.field_2._M_local_buf + 8),
               "targetInstance");
  }
  if (this->m_caseType == CASE_BLOCK_ARRAY) {
    local_394 = 2;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               &targetInterfaceBlock.variables.
                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_394);
  }
  glu::VarType::VarType(&local_410,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"blockMemberBasic",&local_431);
  glu::Layout::Layout(&local_448,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&local_3f8,&local_410,&local_430,STORAGE_LAST,INTERPOLATION_LAST,&local_448,0);
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
            ((vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
             ((long)&targetInterfaceBlock.instanceName.field_2 + 8),&local_3f8);
  glu::VariableDeclaration::~VariableDeclaration(&local_3f8);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  glu::VarType::~VarType(&local_410);
  glu::VarType::VarType(&local_4d8,TYPE_FLOAT,PRECISION_HIGHP);
  glu::VarType::VarType(&local_4c0,&local_4d8,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f8,"blockMemberArray",&local_4f9);
  glu::Layout::Layout((Layout *)&structPtr,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&local_4a8,&local_4c0,&local_4f8,STORAGE_LAST,INTERPOLATION_LAST,(Layout *)&structPtr,0
            );
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
            ((vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
             ((long)&targetInterfaceBlock.instanceName.field_2 + 8),&local_4a8);
  glu::VariableDeclaration::~VariableDeclaration(&local_4a8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  glu::VarType::~VarType(&local_4c0);
  glu::VarType::~VarType(&local_4d8);
  pSVar3 = (StructType *)operator_new(0x38);
  glu::StructType::StructType(pSVar3,"StructType");
  local_518 = pSVar3;
  glu::VarType::VarType(&local_530,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar3,"structMemberBasic",&local_530);
  glu::VarType::~VarType(&local_530);
  pSVar3 = local_518;
  glu::VarType::VarType(&local_560,TYPE_FLOAT,PRECISION_HIGHP);
  glu::VarType::VarType(&local_548,&local_560,2);
  glu::StructType::addMember(pSVar3,"structMemberArray",&local_548);
  glu::VarType::~VarType(&local_548);
  glu::VarType::~VarType(&local_560);
  glu::VarType::VarType(&local_5f0,local_518);
  glu::VarType::VarType(&local_5d8,&local_5f0,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_610,"blockMemberStruct",&local_611);
  glu::Layout::Layout(&local_628,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&local_5c0,&local_5d8,&local_610,STORAGE_LAST,INTERPOLATION_LAST,&local_628,0);
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
            ((vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
             ((long)&targetInterfaceBlock.instanceName.field_2 + 8),&local_5c0);
  glu::VariableDeclaration::~VariableDeclaration(&local_5c0);
  std::__cxx11::string::~string((string *)&local_610);
  std::allocator<char>::~allocator(&local_611);
  glu::VarType::~VarType(&local_5d8);
  glu::VarType::~VarType(&local_5f0);
  if (this->m_storage == STORAGE_BUFFER) {
    glu::VarType::VarType(&local_6b8,TYPE_FLOAT,PRECISION_HIGHP);
    glu::VarType::VarType(&local_6a0,&local_6b8,-1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6d8,"blockMemberUnsizedArray",&local_6d9);
    glu::Layout::Layout((Layout *)
                        &trailingInterfaceBlock.dimensions.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,-1,-1,-1,FORMATLAYOUT_LAST,
                        MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&local_688,&local_6a0,&local_6d8,STORAGE_LAST,INTERPOLATION_LAST,
               (Layout *)
               &trailingInterfaceBlock.dimensions.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
              ((vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
               ((long)&targetInterfaceBlock.instanceName.field_2 + 8),&local_688);
    glu::VariableDeclaration::~VariableDeclaration(&local_688);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::allocator<char>::~allocator(&local_6d9);
    glu::VarType::~VarType(&local_6a0);
    glu::VarType::~VarType(&local_6b8);
  }
  pDVar2 = ProgramInterfaceDefinition::Shader::getDefaultBlock(this_01);
  std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::push_back
            (&pDVar2->interfaceBlocks,(value_type *)local_390);
  glu::InterfaceBlock::~InterfaceBlock((InterfaceBlock *)local_390);
  glu::InterfaceBlock::InterfaceBlock((InterfaceBlock *)local_780);
  std::__cxx11::string::operator=
            ((string *)&trailingInterfaceBlock.memoryAccessQualifierFlags,"TrailingInterface");
  local_780._4_4_ = 3;
  trailingInterfaceBlock.layout.format = this->m_storage;
  std::__cxx11::string::operator=
            ((string *)(trailingInterfaceBlock.interfaceName.field_2._M_local_buf + 8),
             "trailingInstance");
  glu::VarType::VarType(&local_7f8,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_818,"trailingMember",&local_819);
  glu::Layout::Layout(&local_830,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&local_7e0,&local_7f8,&local_818,STORAGE_LAST,INTERPOLATION_LAST,&local_830,0);
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
            ((vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
             ((long)&trailingInterfaceBlock.instanceName.field_2 + 8),&local_7e0);
  glu::VariableDeclaration::~VariableDeclaration(&local_7e0);
  std::__cxx11::string::~string((string *)&local_818);
  std::allocator<char>::~allocator(&local_819);
  glu::VarType::~VarType(&local_7f8);
  pDVar2 = ProgramInterfaceDefinition::Shader::getDefaultBlock(this_01);
  std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::push_back
            (&pDVar2->interfaceBlocks,(value_type *)local_780);
  glu::InterfaceBlock::~InterfaceBlock((InterfaceBlock *)local_780);
  return extraout_EAX;
}

Assistant:

void InterfaceBlockBaseCase::init (void)
{
	const glu::GLSLVersion				glslVersion	= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
	ProgramInterfaceDefinition::Shader*	shader;

	m_program = new ProgramInterfaceDefinition::Program();
	shader = m_program->addShader(glu::SHADERTYPE_COMPUTE, glslVersion);

	// PrecedingInterface
	{
		glu::InterfaceBlock precedingInterfaceBlock;

		precedingInterfaceBlock.interfaceName	= "PrecedingInterface";
		precedingInterfaceBlock.layout.binding	= 0;
		precedingInterfaceBlock.storage			= m_storage;
		precedingInterfaceBlock.instanceName	= "precedingInstance";

		precedingInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), "precedingMember"));

		// Unsized array type
		if (m_storage == glu::STORAGE_BUFFER)
			precedingInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), glu::VarType::UNSIZED_ARRAY), "precedingMemberUnsizedArray"));
		else
			precedingInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), 2), "precedingMemberArray"));

		shader->getDefaultBlock().interfaceBlocks.push_back(precedingInterfaceBlock);
	}

	// TargetInterface
	{
		glu::InterfaceBlock targetInterfaceBlock;

		targetInterfaceBlock.interfaceName	= "TargetInterface";
		targetInterfaceBlock.layout.binding	= 1;
		targetInterfaceBlock.storage		= m_storage;

		if (m_caseType == CASE_UNNAMED_BLOCK)
			targetInterfaceBlock.instanceName = "";
		else
			targetInterfaceBlock.instanceName = "targetInstance";

		if (m_caseType == CASE_BLOCK_ARRAY)
			targetInterfaceBlock.dimensions.push_back(2);

		// Basic type
		{
			targetInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), "blockMemberBasic"));
		}

		// Array type
		{
			targetInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), 3), "blockMemberArray"));
		}

		// Struct type
		{
			glu::StructType* structPtr = new glu::StructType("StructType");
			structPtr->addMember("structMemberBasic", glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));
			structPtr->addMember("structMemberArray", glu::VarType(glu::VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), 2));

			targetInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(structPtr), 2), "blockMemberStruct"));
		}

		// Unsized array type
		if (m_storage == glu::STORAGE_BUFFER)
			targetInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), glu::VarType::UNSIZED_ARRAY), "blockMemberUnsizedArray"));

		shader->getDefaultBlock().interfaceBlocks.push_back(targetInterfaceBlock);
	}

	// TrailingInterface
	{
		glu::InterfaceBlock trailingInterfaceBlock;

		trailingInterfaceBlock.interfaceName	= "TrailingInterface";
		trailingInterfaceBlock.layout.binding	= 3;
		trailingInterfaceBlock.storage			= m_storage;
		trailingInterfaceBlock.instanceName		= "trailingInstance";
		trailingInterfaceBlock.variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), "trailingMember"));

		shader->getDefaultBlock().interfaceBlocks.push_back(trailingInterfaceBlock);
	}

	DE_ASSERT(m_program->isValid());
}